

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

VmConstant * CreateConstantVoid(Allocator *allocator)

{
  VmType type;
  VmConstant *this;
  Allocator *allocator_local;
  
  this = anon_unknown.dwarf_d4e18::get<VmConstant>(allocator);
  type.structType = VmType::Void.structType;
  type.type = VmType::Void.type;
  type.size = VmType::Void.size;
  VmConstant::VmConstant(this,allocator,type,(SynBase *)0x0);
  return this;
}

Assistant:

VmConstant* CreateConstantVoid(Allocator *allocator)
{
	return new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Void, NULL);
}